

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

bool __thiscall
cmComputeTargetDepends::ComputeFinalDepends
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  int iVar1;
  int n_00;
  value_type vVar2;
  bool bVar3;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_00;
  vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> *this_01;
  size_type sVar4;
  vector<int,_std::allocator<int>_> *cmap_00;
  reference piVar5;
  reference pvVar6;
  reference this_02;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_03;
  pointer this_04;
  cmGraphEdge local_108;
  int local_100;
  int local_fc;
  int dependee_component_head;
  int dependee_component;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_f0;
  const_iterator ni_1;
  EdgeList *nl_1;
  int depender_component_tail;
  int depender_component;
  int n;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  undefined1 local_90 [16];
  const_reverse_iterator ni;
  NodeList *nl;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  int local_40;
  int head;
  int c;
  int nc;
  vector<int,_std::allocator<int>_> *cmap;
  Graph *cgraph;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  cmComputeComponentGraph *ccg_local;
  cmComputeTargetDepends *this_local;
  
  this_00 = cmComputeComponentGraph::GetComponents(ccg);
  this_01 = &cmComputeComponentGraph::GetComponentGraph(ccg)->
             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  sVar4 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&(this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             sVar4);
  cmap_00 = cmComputeComponentGraph::GetComponentMap(ccg);
  sVar4 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  std::vector<int,_std::allocator<int>_>::resize(&this->ComponentHead,sVar4);
  sVar4 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  std::vector<int,_std::allocator<int>_>::resize(&this->ComponentTail,sVar4);
  sVar4 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  for (local_40 = 0; local_40 < (int)sVar4; local_40 = local_40 + 1) {
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = -1;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&nl);
    ni.current._M_current =
         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
         std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                   (this_00,(long)local_40);
    std::vector<int,_std::allocator<int>_>::rbegin
              ((vector<int,_std::allocator<int>_> *)(local_90 + 8));
    while( true ) {
      std::vector<int,_std::allocator<int>_>::rend((vector<int,_std::allocator<int>_> *)local_90);
      bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                               *)(local_90 + 8),
                              (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                               *)local_90);
      vVar2 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      if (!bVar3) break;
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&n);
      piVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                            *)(local_90 + 8));
      bVar3 = IntraComponent(this,cmap_00,local_40,*piVar5,
                             (int *)((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    + 4),(set<int,_std::less<int>,_std::allocator<int>_> *)&nl,
                             (set<int,_std::less<int>,_std::allocator<int>_> *)&n);
      if (!bVar3) {
        ComplainAboutBadComponent(this,ccg,local_40,true);
        this_local._7_1_ = 0;
      }
      bVar3 = !bVar3;
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&n);
      if (bVar3) goto LAB_00819353;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                    *)(local_90 + 8));
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->ComponentHead,(long)local_40)
    ;
    *pvVar6 = vVar2;
    bVar3 = false;
LAB_00819353:
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&nl);
    if (bVar3) goto LAB_00819501;
  }
  sVar4 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size(this_01);
  for (nl_1._4_4_ = 0; nl_1._4_4_ < (int)sVar4; nl_1._4_4_ = nl_1._4_4_ + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->ComponentTail,(long)nl_1._4_4_);
    iVar1 = *pvVar6;
    ni_1._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                   (this_01,(long)nl_1._4_4_);
    local_f0._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                   ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)ni_1._M_current);
    while( true ) {
      _dependee_component_head =
           std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(ni_1._M_current);
      bVar3 = __gnu_cxx::operator!=
                        (&local_f0,
                         (__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                          *)&dependee_component_head);
      if (!bVar3) break;
      this_02 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&local_f0);
      local_fc = cmGraphEdge::operator_cast_to_int(this_02);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->ComponentHead,(long)local_fc);
      local_100 = *pvVar6;
      this_03 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                           (&(this->FinalGraph).
                             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                            (long)iVar1)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      n_00 = local_100;
      this_04 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator->(&local_f0);
      bVar3 = cmGraphEdge::IsStrong(this_04);
      cmGraphEdge::cmGraphEdge(&local_108,n_00,bVar3);
      std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back(this_03,&local_108);
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&local_f0);
    }
  }
  this_local._7_1_ = 1;
LAB_00819501:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmComputeTargetDepends::ComputeFinalDepends(
  cmComputeComponentGraph const& ccg)
{
  // Get the component graph information.
  std::vector<NodeList> const& components = ccg.GetComponents();
  Graph const& cgraph = ccg.GetComponentGraph();

  // Allocate the final graph.
  this->FinalGraph.resize(0);
  this->FinalGraph.resize(this->InitialGraph.size());

  // Choose intra-component edges to linearize dependencies.
  std::vector<int> const& cmap = ccg.GetComponentMap();
  this->ComponentHead.resize(components.size());
  this->ComponentTail.resize(components.size());
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    int head = -1;
    std::set<int> emitted;
    NodeList const& nl = components[c];
    for (NodeList::const_reverse_iterator ni = nl.rbegin(); ni != nl.rend();
         ++ni) {
      std::set<int> visited;
      if (!this->IntraComponent(cmap, c, *ni, &head, emitted, visited)) {
        // Cycle in add_dependencies within component!
        this->ComplainAboutBadComponent(ccg, c, true);
        return false;
      }
    }
    this->ComponentHead[c] = head;
  }

  // Convert inter-component edges to connect component tails to heads.
  int n = static_cast<int>(cgraph.size());
  for (int depender_component = 0; depender_component < n;
       ++depender_component) {
    int depender_component_tail = this->ComponentTail[depender_component];
    EdgeList const& nl = cgraph[depender_component];
    for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      int dependee_component = *ni;
      int dependee_component_head = this->ComponentHead[dependee_component];
      this->FinalGraph[depender_component_tail].push_back(
        cmGraphEdge(dependee_component_head, ni->IsStrong()));
    }
  }
  return true;
}